

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

int Parser_xmlNamespace(Parser *xmlParser,IXML_Node_conflict *newNode)

{
  IXML_ElementStack *pIVar1;
  IXML_Node_conflict *pIVar2;
  char *__s2;
  int iVar3;
  uint uVar4;
  int iVar5;
  IXML_NamespaceURI *pIVar6;
  char *pcVar7;
  IXML_ElementStack *pCur;
  IXML_NamespaceURI *pIVar8;
  _IXML_NamespaceURI **pp_Var9;
  
  pcVar7 = newNode->nodeName;
  if (pcVar7 == (char *)0x0) {
    __assert_fail("newNode->nodeName != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0x6f0,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
  }
  pIVar1 = xmlParser->pCurElement;
  iVar3 = strcmp(pcVar7,"xmlns");
  if (iVar3 == 0) {
    if (pIVar1->namespaceUri != (char *)0x0) {
      free(pIVar1->namespaceUri);
    }
    pcVar7 = safe_strdup(newNode->nodeValue);
    pIVar1->namespaceUri = pcVar7;
    if (pcVar7 == (char *)0x0) {
      uVar4 = 0x66;
      iVar3 = 0x6fa;
      goto LAB_001055a9;
    }
  }
  else {
    iVar3 = strncmp(pcVar7,"xmlns:",6);
    if (iVar3 == 0) {
      uVar4 = Parser_setNodePrefixAndLocalName(newNode);
      if (uVar4 != 0) {
        iVar3 = 0x702;
        goto LAB_001055a9;
      }
      pcVar7 = newNode->localName;
      if (pcVar7 == (char *)0x0) {
        __assert_fail("newNode->localName != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                      ,0x706,"int Parser_xmlNamespace(Parser *, IXML_Node *)");
      }
      if (pIVar1 == (IXML_ElementStack *)0x0) {
        uVar4 = 0x6a;
        iVar3 = 0x70a;
        goto LAB_001055a9;
      }
      if ((pIVar1->prefix == (char *)0x0) || (iVar3 = strcmp(pIVar1->prefix,pcVar7), iVar3 != 0)) {
        pIVar6 = pIVar1->pNsURI;
        if (pIVar1->pNsURI == (IXML_NamespaceURI *)0x0) {
          pIVar8 = (IXML_NamespaceURI *)0x0;
        }
        else {
          do {
            pIVar8 = pIVar6;
            if ((pIVar8->prefix != (char *)0x0) &&
               (iVar3 = strcmp(pIVar8->prefix,pcVar7), iVar3 == 0)) {
              if (pIVar8->nsURI != (char *)0x0) {
                free(pIVar8->nsURI);
              }
              pcVar7 = safe_strdup(newNode->nodeValue);
              pIVar8->nsURI = pcVar7;
              if (pcVar7 != (char *)0x0) goto LAB_0010536a;
              uVar4 = 0x66;
              iVar3 = 0x74d;
              goto LAB_001055a9;
            }
            pIVar6 = pIVar8->nextNsURI;
          } while (pIVar8->nextNsURI != (_IXML_NamespaceURI *)0x0);
        }
        pIVar6 = (IXML_NamespaceURI *)calloc(1,0x18);
        uVar4 = 0x66;
        if (pIVar6 == (IXML_NamespaceURI *)0x0) {
          iVar3 = 0x72c;
          goto LAB_001055a9;
        }
        pcVar7 = safe_strdup(pcVar7);
        pIVar6->prefix = pcVar7;
        if (pcVar7 == (char *)0x0) {
          iVar3 = 0x735;
        }
        else {
          pcVar7 = safe_strdup(newNode->nodeValue);
          pIVar6->nsURI = pcVar7;
          if (pcVar7 != (char *)0x0) {
            pp_Var9 = &pIVar8->nextNsURI;
            if (pIVar1->pNsURI == (IXML_NamespaceURI *)0x0) {
              pp_Var9 = &pIVar1->pNsURI;
            }
            *pp_Var9 = pIVar6;
            goto LAB_0010536a;
          }
          Parser_freeNsURI(pIVar6);
          iVar3 = 0x73d;
        }
        free(pIVar6);
        goto LAB_001055a9;
      }
      if (pIVar1->namespaceUri != (char *)0x0) {
        free(pIVar1->namespaceUri);
      }
      pcVar7 = safe_strdup(newNode->nodeValue);
      pIVar1->namespaceUri = pcVar7;
      if (pcVar7 == (char *)0x0) {
        uVar4 = 0x66;
        iVar3 = 0x715;
        goto LAB_001055a9;
      }
    }
  }
LAB_0010536a:
  pIVar2 = xmlParser->pNeedPrefixNode;
  if (pIVar2 == (IXML_Node_conflict *)0x0) {
    return 0;
  }
  pIVar1 = xmlParser->pCurElement;
  pcVar7 = pIVar2->prefix;
  if (pcVar7 == (char *)0x0) {
    iVar5 = strcmp(pIVar2->nodeName,pIVar1->element);
    uVar4 = 0x6a;
    iVar3 = 0x755;
    if (iVar5 != 0) goto LAB_001055a9;
    if (pIVar1->namespaceUri == (char *)0x0) goto LAB_0010542b;
    if (pIVar2->namespaceURI != (char *)0x0) {
      __assert_fail("pNode->namespaceURI == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                    ,0x6c8,"int Parser_addNamespace(Parser *)");
    }
    pcVar7 = strdup(pIVar1->namespaceUri);
    pIVar2->namespaceURI = pcVar7;
joined_r0x00105429:
    if (pcVar7 != (char *)0x0) {
LAB_0010542b:
      xmlParser->pNeedPrefixNode = (IXML_Node_conflict *)0x0;
      return 0;
    }
    uVar4 = 0x66;
  }
  else {
    __s2 = pIVar1->prefix;
    uVar4 = 0x6a;
    iVar3 = 0x755;
    if (__s2 == (char *)0x0) goto LAB_001055a9;
    iVar3 = strcmp(pIVar2->nodeName,pIVar1->element);
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,__s2), iVar3 == 0)) {
      if (pIVar1->namespaceUri == (char *)0x0) {
        return 0;
      }
      pcVar7 = strdup(pIVar1->namespaceUri);
      pIVar2->namespaceURI = pcVar7;
      goto joined_r0x00105429;
    }
  }
  iVar3 = 0x755;
LAB_001055a9:
  IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
             ,iVar3,"Parser_xmlNamespace","Error %d\n",(ulong)uVar4);
  return uVar4;
}

Assistant:

static int Parser_xmlNamespace(
	/*! [in] The XML parser. */
	Parser *xmlParser,
	/*! [in] The Node to process. */
	IXML_Node *newNode)
{
	IXML_ElementStack *pCur = xmlParser->pCurElement;
	IXML_NamespaceURI *pNewNs = NULL;
	IXML_NamespaceURI *pNs = NULL;
	IXML_NamespaceURI *pPrevNs = NULL;
	int ret = IXML_SUCCESS;
	int line = 0;

	/* if the newNode contains a namespace definition */
	assert(newNode->nodeName != NULL);

	if (strcmp(newNode->nodeName, "xmlns") == 0) {
		/* default namespace def. */
		if (pCur->namespaceUri != NULL) {
			free(pCur->namespaceUri);
		}
		pCur->namespaceUri = safe_strdup(newNode->nodeValue);
		if (pCur->namespaceUri == NULL) {
			ret = IXML_INSUFFICIENT_MEMORY;
			line = __LINE__;
			goto ExitFunction;
		}
	} else if (strncmp(newNode->nodeName, "xmlns:", strlen("xmlns:")) ==
		   0) {
		/* namespace definition */
		ret = Parser_setNodePrefixAndLocalName(newNode);
		if (ret != IXML_SUCCESS) {
			line = __LINE__;
			goto ExitFunction;
		}

		assert(newNode->localName != NULL);

		if (pCur == NULL) {
			ret = IXML_FAILED;
			line = __LINE__;
			goto ExitFunction;
		}
		if (pCur->prefix != NULL &&
			strcmp(pCur->prefix, newNode->localName) == 0) {
			if (pCur->namespaceUri != NULL) {
				free(pCur->namespaceUri);
			}
			pCur->namespaceUri = safe_strdup(newNode->nodeValue);
			if (pCur->namespaceUri == NULL) {
				ret = IXML_INSUFFICIENT_MEMORY;
				line = __LINE__;
				goto ExitFunction;
			}
		} else {
			pPrevNs = pCur->pNsURI;
			pNs = pPrevNs;
			while (pNs != NULL) {
				if (pNs->prefix != NULL &&
					strcmp(pNs->prefix,
						newNode->localName) == 0) {
					/* replace namespace definition */
					break;
				} else {
					pPrevNs = pNs;
					pNs = pNs->nextNsURI;
				}
			}
			if (pNs == NULL) {
				/* a new definition */
				pNewNs = (IXML_NamespaceURI *)malloc(
					sizeof(IXML_NamespaceURI));
				if (pNewNs == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				memset(pNewNs, 0, sizeof(IXML_NamespaceURI));
				pNewNs->prefix =
					safe_strdup(newNode->localName);
				if (pNewNs->prefix == NULL) {
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				pNewNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNewNs->nsURI == NULL) {
					Parser_freeNsURI(pNewNs);
					free(pNewNs);
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
				if (pCur->pNsURI == NULL) {
					pCur->pNsURI = pNewNs;
				} else {
					pPrevNs->nextNsURI = pNewNs;
				}
			} else {
				/* udpate the namespace */
				if (pNs->nsURI != NULL) {
					free(pNs->nsURI);
				}
				pNs->nsURI = safe_strdup(newNode->nodeValue);
				if (pNs->nsURI == NULL) {
					ret = IXML_INSUFFICIENT_MEMORY;
					line = __LINE__;
					goto ExitFunction;
				}
			}
		}
	}
	if (xmlParser->pNeedPrefixNode != NULL) {
		ret = Parser_addNamespace(xmlParser);
		line = __LINE__;
		goto ExitFunction;
	}

ExitFunction:
	if (ret != IXML_SUCCESS && ret != IXML_FILE_DONE) {
		IxmlPrintf(__FILE__,
			line,
			"Parser_xmlNamespace",
			"Error %d\n",
			ret);
	}

	return ret;
}